

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O3

void secp256k1_keyagg_cache_save
               (secp256k1_musig_keyagg_cache *cache,secp256k1_keyagg_cache_internal *cache_i)

{
  uchar *buf;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  cache->data[0] = 0xf4;
  cache->data[1] = 0xad;
  cache->data[2] = 0xbb;
  cache->data[3] = 0xdf;
  secp256k1_ge_to_bytes(cache->data + 4,&cache_i->pk);
  buf = cache->data + 0x44;
  if ((cache_i->second_pk).infinity == 0) {
    secp256k1_ge_to_bytes(buf,&cache_i->second_pk);
  }
  else {
    cache->data[0x74] = '\0';
    cache->data[0x75] = '\0';
    cache->data[0x76] = '\0';
    cache->data[0x77] = '\0';
    cache->data[0x78] = '\0';
    cache->data[0x79] = '\0';
    cache->data[0x7a] = '\0';
    cache->data[0x7b] = '\0';
    cache->data[0x7c] = '\0';
    cache->data[0x7d] = '\0';
    cache->data[0x7e] = '\0';
    cache->data[0x7f] = '\0';
    cache->data[0x80] = '\0';
    cache->data[0x81] = '\0';
    cache->data[0x82] = '\0';
    cache->data[0x83] = '\0';
    cache->data[100] = '\0';
    cache->data[0x65] = '\0';
    cache->data[0x66] = '\0';
    cache->data[0x67] = '\0';
    cache->data[0x68] = '\0';
    cache->data[0x69] = '\0';
    cache->data[0x6a] = '\0';
    cache->data[0x6b] = '\0';
    cache->data[0x6c] = '\0';
    cache->data[0x6d] = '\0';
    cache->data[0x6e] = '\0';
    cache->data[0x6f] = '\0';
    cache->data[0x70] = '\0';
    cache->data[0x71] = '\0';
    cache->data[0x72] = '\0';
    cache->data[0x73] = '\0';
    cache->data[0x54] = '\0';
    cache->data[0x55] = '\0';
    cache->data[0x56] = '\0';
    cache->data[0x57] = '\0';
    cache->data[0x58] = '\0';
    cache->data[0x59] = '\0';
    cache->data[0x5a] = '\0';
    cache->data[0x5b] = '\0';
    cache->data[0x5c] = '\0';
    cache->data[0x5d] = '\0';
    cache->data[0x5e] = '\0';
    cache->data[0x5f] = '\0';
    cache->data[0x60] = '\0';
    cache->data[0x61] = '\0';
    cache->data[0x62] = '\0';
    cache->data[99] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    cache->data[0x4c] = '\0';
    cache->data[0x4d] = '\0';
    cache->data[0x4e] = '\0';
    cache->data[0x4f] = '\0';
    cache->data[0x50] = '\0';
    cache->data[0x51] = '\0';
    cache->data[0x52] = '\0';
    cache->data[0x53] = '\0';
  }
  uVar1 = *(undefined8 *)cache_i->pks_hash;
  uVar2 = *(undefined8 *)(cache_i->pks_hash + 8);
  uVar3 = *(undefined8 *)(cache_i->pks_hash + 0x18);
  *(undefined8 *)(cache->data + 0x94) = *(undefined8 *)(cache_i->pks_hash + 0x10);
  *(undefined8 *)(cache->data + 0x9c) = uVar3;
  *(undefined8 *)(cache->data + 0x84) = uVar1;
  *(undefined8 *)(cache->data + 0x8c) = uVar2;
  cache->data[0xa4] = (uchar)cache_i->parity_acc;
  secp256k1_scalar_get_b32(cache->data + 0xa5,&cache_i->tweak);
  return;
}

Assistant:

static void secp256k1_keyagg_cache_save(secp256k1_musig_keyagg_cache *cache, const secp256k1_keyagg_cache_internal *cache_i) {
    unsigned char *ptr = cache->data;
    memcpy(ptr, secp256k1_musig_keyagg_cache_magic, 4);
    ptr += 4;
    secp256k1_ge_to_bytes(ptr, &cache_i->pk);
    ptr += 64;
    secp256k1_ge_to_bytes_ext(ptr, &cache_i->second_pk);
    ptr += 64;
    memcpy(ptr, cache_i->pks_hash, 32);
    ptr += 32;
    *ptr = cache_i->parity_acc;
    ptr += 1;
    secp256k1_scalar_get_b32(ptr, &cache_i->tweak);
}